

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void anon_unknown.dwarf_a3d2::do_encode_decode_float_test(float expected)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  key_encoder *this;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  undefined1 local_1c8 [8];
  key_decoder dec_1;
  undefined1 local_1a8 [4];
  U u;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_;
  undefined1 local_150 [8];
  key_decoder dec;
  F actual;
  undefined1 local_128 [8];
  key_encoder enc;
  float expected_local;
  
  enc.off._4_4_ = expected;
  unodb::key_encoder::key_encoder((key_encoder *)local_128);
  this = unodb::key_encoder::reset((key_encoder *)local_128);
  unodb::key_encoder::encode(this,enc.off._4_4_);
  join_0x00000010_0x00000000_ = unodb::key_encoder::get_key_view((key_encoder *)local_128);
  unodb::key_decoder::key_decoder((key_decoder *)local_150,join_0x00000010_0x00000000_);
  unodb::key_decoder::decode((key_decoder *)local_150,(float *)&dec.off);
  uVar2 = std::isnan((double)(ulong)(uint)enc.off._4_4_);
  if ((uVar2 & 1) == 0) {
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((EqHelper *)local_1e8,"(actual)","(expected)",(float *)&dec.off,
               (float *)((long)&enc.off + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x193,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  }
  else {
    iVar3 = std::isnan((double)(ulong)(uint)dec.off);
    local_171 = (bool)((byte)iVar3 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_170,&local_171,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1a8,(internal *)local_170,(AssertionResult *)"std::isnan(actual)",
                 "false","true",in_R9);
      pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8)
      ;
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x18e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_188,&local_180);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      std::__cxx11::string::~string((string *)local_1a8);
      testing::Message::~Message(&local_180);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    join_0x00000010_0x00000000_ = unodb::key_encoder::get_key_view((key_encoder *)local_128);
    unodb::key_decoder::key_decoder((key_decoder *)local_1c8,join_0x00000010_0x00000000_);
    unodb::key_decoder::decode((key_decoder *)local_1c8,(uint32_t *)((long)&dec_1.off + 4));
  }
  unodb::key_encoder::~key_encoder((key_encoder *)local_128);
  return;
}

Assistant:

void do_encode_decode_float_test(const float expected) {
  using U = std::uint32_t;
  using F = float;
  // encode
  unodb::key_encoder enc;
  enc.reset().encode(expected);
  // Check decode as float (round trip).
  F actual;
  {
    unodb::key_decoder dec{enc.get_key_view()};
    dec.decode(actual);
  }
  if (std::isnan(expected)) {
    // Verify canonical NaN.
    UNODB_EXPECT_TRUE(std::isnan(actual));
    U u;
    unodb::key_decoder dec{enc.get_key_view()};
    dec.decode(u);
  } else {
    UNODB_EXPECT_EQ(actual, expected);
  }
}